

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1Char> *b)

{
  Data *pDVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  long asize;
  long lVar4;
  long in_FS_OFFSET;
  QChar *it;
  QChar *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (((b->a).b)->d).size + (a->d).size + (b->a).a.m_size + 1;
  QString::detach(a);
  qVar2 = QArrayDataPointer<char16_t>::freeSpaceAtEnd(&a->d);
  if (qVar2 < lVar4) {
    pDVar1 = (a->d).d;
    if (pDVar1 == (Data *)0x0) {
      asize = 0;
    }
    else {
      asize = (pDVar1->super_QArrayData).alloc * 2;
    }
    if (asize < lVar4) {
      asize = lVar4;
    }
    QString::reserve(a,asize);
  }
  local_28 = QString::data(a);
  local_28 = local_28 + (a->d).size;
  QConcatenable<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1Char>_>::
  appendTo<QChar>(b,&local_28);
  pcVar3 = (a->d).ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = L"";
  }
  QString::resize(a,(long)local_28 - (long)pcVar3 >> 1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}